

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTypes.h
# Opt level: O0

char * glslang::GetBuiltInVariableString(TBuiltInVariable v)

{
  char *pcStack_10;
  TBuiltInVariable v_local;
  
  switch(v) {
  case EbvNone:
    pcStack_10 = "";
    break;
  case EbvNumWorkGroups:
    pcStack_10 = "NumWorkGroups";
    break;
  case EbvWorkGroupSize:
    pcStack_10 = "WorkGroupSize";
    break;
  case EbvWorkGroupId:
    pcStack_10 = "WorkGroupID";
    break;
  case EbvLocalInvocationId:
    pcStack_10 = "LocalInvocationID";
    break;
  case EbvGlobalInvocationId:
    pcStack_10 = "GlobalInvocationID";
    break;
  case EbvLocalInvocationIndex:
    pcStack_10 = "LocalInvocationIndex";
    break;
  case EbvNumSubgroups:
    pcStack_10 = "NumSubgroups";
    break;
  case EbvSubgroupID:
    pcStack_10 = "SubgroupID";
    break;
  case EbvSubGroupSize:
    pcStack_10 = "SubGroupSize";
    break;
  case EbvSubGroupInvocation:
    pcStack_10 = "SubGroupInvocation";
    break;
  case EbvSubGroupEqMask:
    pcStack_10 = "SubGroupEqMask";
    break;
  case EbvSubGroupGeMask:
    pcStack_10 = "SubGroupGeMask";
    break;
  case EbvSubGroupGtMask:
    pcStack_10 = "SubGroupGtMask";
    break;
  case EbvSubGroupLeMask:
    pcStack_10 = "SubGroupLeMask";
    break;
  case EbvSubGroupLtMask:
    pcStack_10 = "SubGroupLtMask";
    break;
  case EbvSubgroupSize2:
    pcStack_10 = "SubgroupSize";
    break;
  case EbvSubgroupInvocation2:
    pcStack_10 = "SubgroupInvocationID";
    break;
  case EbvSubgroupEqMask2:
    pcStack_10 = "SubgroupEqMask";
    break;
  case EbvSubgroupGeMask2:
    pcStack_10 = "SubgroupGeMask";
    break;
  case EbvSubgroupGtMask2:
    pcStack_10 = "SubgroupGtMask";
    break;
  case EbvSubgroupLeMask2:
    pcStack_10 = "SubgroupLeMask";
    break;
  case EbvSubgroupLtMask2:
    pcStack_10 = "SubgroupLtMask";
    break;
  case EbvVertexId:
    pcStack_10 = "VertexId";
    break;
  case EbvInstanceId:
    pcStack_10 = "InstanceId";
    break;
  case EbvVertexIndex:
    pcStack_10 = "VertexIndex";
    break;
  case EbvInstanceIndex:
    pcStack_10 = "InstanceIndex";
    break;
  case EbvBaseVertex:
    pcStack_10 = "BaseVertex";
    break;
  case EbvBaseInstance:
    pcStack_10 = "BaseInstance";
    break;
  case EbvDrawId:
    pcStack_10 = "DrawId";
    break;
  case EbvPosition:
    pcStack_10 = "Position";
    break;
  case EbvPointSize:
    pcStack_10 = "PointSize";
    break;
  case EbvClipVertex:
    pcStack_10 = "ClipVertex";
    break;
  case EbvClipDistance:
    pcStack_10 = "ClipDistance";
    break;
  case EbvCullDistance:
    pcStack_10 = "CullDistance";
    break;
  case EbvNormal:
    pcStack_10 = "Normal";
    break;
  case EbvVertex:
    pcStack_10 = "Vertex";
    break;
  case EbvMultiTexCoord0:
    pcStack_10 = "MultiTexCoord0";
    break;
  case EbvMultiTexCoord1:
    pcStack_10 = "MultiTexCoord1";
    break;
  case EbvMultiTexCoord2:
    pcStack_10 = "MultiTexCoord2";
    break;
  case EbvMultiTexCoord3:
    pcStack_10 = "MultiTexCoord3";
    break;
  case EbvMultiTexCoord4:
    pcStack_10 = "MultiTexCoord4";
    break;
  case EbvMultiTexCoord5:
    pcStack_10 = "MultiTexCoord5";
    break;
  case EbvMultiTexCoord6:
    pcStack_10 = "MultiTexCoord6";
    break;
  case EbvMultiTexCoord7:
    pcStack_10 = "MultiTexCoord7";
    break;
  case EbvFrontColor:
    pcStack_10 = "FrontColor";
    break;
  case EbvBackColor:
    pcStack_10 = "BackColor";
    break;
  case EbvFrontSecondaryColor:
    pcStack_10 = "FrontSecondaryColor";
    break;
  case EbvBackSecondaryColor:
    pcStack_10 = "BackSecondaryColor";
    break;
  case EbvTexCoord:
    pcStack_10 = "TexCoord";
    break;
  case EbvFogFragCoord:
    pcStack_10 = "FogFragCoord";
    break;
  case EbvInvocationId:
    pcStack_10 = "InvocationID";
    break;
  case EbvPrimitiveId:
    pcStack_10 = "PrimitiveID";
    break;
  case EbvLayer:
    pcStack_10 = "Layer";
    break;
  case EbvViewportIndex:
    pcStack_10 = "ViewportIndex";
    break;
  case EbvPatchVertices:
    pcStack_10 = "PatchVertices";
    break;
  case EbvTessLevelOuter:
    pcStack_10 = "TessLevelOuter";
    break;
  case EbvTessLevelInner:
    pcStack_10 = "TessLevelInner";
    break;
  case EbvBoundingBox:
    pcStack_10 = "BoundingBox";
    break;
  case EbvTessCoord:
    pcStack_10 = "TessCoord";
    break;
  case EbvColor:
    pcStack_10 = "Color";
    break;
  case EbvSecondaryColor:
    pcStack_10 = "SecondaryColor";
    break;
  case EbvFace:
    pcStack_10 = "Face";
    break;
  case EbvFragCoord:
    pcStack_10 = "FragCoord";
    break;
  case EbvPointCoord:
    pcStack_10 = "PointCoord";
    break;
  case EbvFragColor:
    pcStack_10 = "FragColor";
    break;
  case EbvFragData:
    pcStack_10 = "FragData";
    break;
  case EbvFragDepth:
    pcStack_10 = "FragDepth";
    break;
  case EbvFragStencilRef:
    pcStack_10 = "FragStencilRef";
    break;
  case EbvSampleId:
    pcStack_10 = "SampleId";
    break;
  case EbvSamplePosition:
    pcStack_10 = "SamplePosition";
    break;
  case EbvSampleMask:
    pcStack_10 = "SampleMaskIn";
    break;
  case EbvHelperInvocation:
    pcStack_10 = "HelperInvocation";
    break;
  case EbvBaryCoordNoPersp:
    pcStack_10 = "BaryCoordNoPersp";
    break;
  case EbvBaryCoordNoPerspCentroid:
    pcStack_10 = "BaryCoordNoPerspCentroid";
    break;
  case EbvBaryCoordNoPerspSample:
    pcStack_10 = "BaryCoordNoPerspSample";
    break;
  case EbvBaryCoordSmooth:
    pcStack_10 = "BaryCoordSmooth";
    break;
  case EbvBaryCoordSmoothCentroid:
    pcStack_10 = "BaryCoordSmoothCentroid";
    break;
  case EbvBaryCoordSmoothSample:
    pcStack_10 = "BaryCoordSmoothSample";
    break;
  case EbvBaryCoordPullModel:
    pcStack_10 = "BaryCoordPullModel";
    break;
  case EbvViewIndex:
    pcStack_10 = "ViewIndex";
    break;
  case EbvDeviceIndex:
    pcStack_10 = "DeviceIndex";
    break;
  case EbvShadingRateKHR:
    pcStack_10 = "ShadingRateKHR";
    break;
  case EbvPrimitiveShadingRateKHR:
    pcStack_10 = "PrimitiveShadingRateKHR";
    break;
  case EbvFragSizeEXT:
    pcStack_10 = "FragSizeEXT";
    break;
  case EbvFragInvocationCountEXT:
    pcStack_10 = "FragInvocationCountEXT";
    break;
  case EbvSecondaryFragDataEXT:
    pcStack_10 = "SecondaryFragDataEXT";
    break;
  case EbvSecondaryFragColorEXT:
    pcStack_10 = "SecondaryFragColorEXT";
    break;
  case EbvViewportMaskNV:
    pcStack_10 = "ViewportMaskNV";
    break;
  case EbvSecondaryPositionNV:
    pcStack_10 = "SecondaryPositionNV";
    break;
  case EbvSecondaryViewportMaskNV:
    pcStack_10 = "SecondaryViewportMaskNV";
    break;
  case EbvPositionPerViewNV:
    pcStack_10 = "PositionPerViewNV";
    break;
  case EbvViewportMaskPerViewNV:
    pcStack_10 = "ViewportMaskPerViewNV";
    break;
  case EbvFragFullyCoveredNV:
    pcStack_10 = "FragFullyCoveredNV";
    break;
  case EbvFragmentSizeNV:
    pcStack_10 = "FragmentSizeNV";
    break;
  case EbvInvocationsPerPixelNV:
    pcStack_10 = "InvocationsPerPixelNV";
    break;
  case EbvLaunchId:
    pcStack_10 = "LaunchIdNV";
    break;
  case EbvLaunchSize:
    pcStack_10 = "LaunchSizeNV";
    break;
  case EbvInstanceCustomIndex:
    pcStack_10 = "InstanceCustomIndexNV";
    break;
  case EbvGeometryIndex:
    pcStack_10 = "GeometryIndexEXT";
    break;
  case EbvWorldRayOrigin:
    pcStack_10 = "WorldRayOriginNV";
    break;
  case EbvWorldRayDirection:
    pcStack_10 = "WorldRayDirectionNV";
    break;
  case EbvObjectRayOrigin:
    pcStack_10 = "ObjectRayOriginNV";
    break;
  case EbvObjectRayDirection:
    pcStack_10 = "ObjectRayDirectionNV";
    break;
  case EbvRayTmin:
    pcStack_10 = "ObjectRayTminNV";
    break;
  case EbvRayTmax:
    pcStack_10 = "ObjectRayTmaxNV";
    break;
  default:
    pcStack_10 = "unknown built-in variable";
    break;
  case EbvHitKind:
    pcStack_10 = "HitKindNV";
    break;
  case EbvObjectToWorld:
    pcStack_10 = "ObjectToWorldNV";
    break;
  case EbvWorldToObject:
    pcStack_10 = "WorldToObjectNV";
    break;
  case EbvIncomingRayFlags:
    pcStack_10 = "IncomingRayFlagsNV";
    break;
  case EbvCurrentRayTimeNV:
    pcStack_10 = "CurrentRayTimeNV";
    break;
  case EbvClusterIDNV:
    pcStack_10 = "ClusterIDNV";
    break;
  case EbvBaryCoordNV:
  case EbvBaryCoordEXT:
    pcStack_10 = "BaryCoordKHR";
    break;
  case EbvBaryCoordNoPerspNV:
  case EbvBaryCoordNoPerspEXT:
    pcStack_10 = "BaryCoordNoPerspKHR";
    break;
  case EbvTaskCountNV:
    pcStack_10 = "TaskCountNV";
    break;
  case EbvPrimitiveCountNV:
    pcStack_10 = "PrimitiveCountNV";
    break;
  case EbvPrimitiveIndicesNV:
    pcStack_10 = "PrimitiveIndicesNV";
    break;
  case EbvClipDistancePerViewNV:
    pcStack_10 = "ClipDistancePerViewNV";
    break;
  case EbvCullDistancePerViewNV:
    pcStack_10 = "CullDistancePerViewNV";
    break;
  case EbvLayerPerViewNV:
    pcStack_10 = "LayerPerViewNV";
    break;
  case EbvMeshViewCountNV:
    pcStack_10 = "MeshViewCountNV";
    break;
  case EbvMeshViewIndicesNV:
    pcStack_10 = "MeshViewIndicesNV";
    break;
  case EbvHitKindFrontFacingMicroTriangleNV:
    pcStack_10 = "HitKindFrontFacingMicroTriangleNV";
    break;
  case EbvHitKindBackFacingMicroTriangleNV:
    pcStack_10 = "HitKindBackFacingMicroTriangleNV";
    break;
  case EbvHitIsSphereNV:
    pcStack_10 = "HitIsSphereNV";
    break;
  case EbvHitIsLSSNV:
    pcStack_10 = "HitIsLSSNV";
    break;
  case EbvHitSpherePositionNV:
    pcStack_10 = "HitSpherePositionNV";
    break;
  case EbvHitSphereRadiusNV:
    pcStack_10 = "HitSphereRadiusNV";
    break;
  case EbvHitLSSPositionsNV:
    pcStack_10 = "HitSpherePositionsNV";
    break;
  case EbvHitLSSRadiiNV:
    pcStack_10 = "HitLSSRadiiNV";
    break;
  case EbvPrimitivePointIndicesEXT:
    pcStack_10 = "PrimitivePointIndicesEXT";
    break;
  case EbvPrimitiveLineIndicesEXT:
    pcStack_10 = "PrimitiveLineIndicesEXT";
    break;
  case EbvPrimitiveTriangleIndicesEXT:
    pcStack_10 = "PrimitiveTriangleIndicesEXT";
    break;
  case EbvCullPrimitiveEXT:
    pcStack_10 = "CullPrimitiveEXT";
    break;
  case EbvWarpsPerSM:
    pcStack_10 = "WarpsPerSMNV";
    break;
  case EbvSMCount:
    pcStack_10 = "SMCountNV";
    break;
  case EbvWarpID:
    pcStack_10 = "WarpIDNV";
    break;
  case EbvSMID:
    pcStack_10 = "SMIDNV";
  }
  return pcStack_10;
}

Assistant:

__inline const char* GetBuiltInVariableString(TBuiltInVariable v)
{
    switch (v) {
    case EbvNone:                 return "";
    case EbvNumWorkGroups:        return "NumWorkGroups";
    case EbvWorkGroupSize:        return "WorkGroupSize";
    case EbvWorkGroupId:          return "WorkGroupID";
    case EbvLocalInvocationId:    return "LocalInvocationID";
    case EbvGlobalInvocationId:   return "GlobalInvocationID";
    case EbvLocalInvocationIndex: return "LocalInvocationIndex";
    case EbvNumSubgroups:         return "NumSubgroups";
    case EbvSubgroupID:           return "SubgroupID";
    case EbvSubGroupSize:         return "SubGroupSize";
    case EbvSubGroupInvocation:   return "SubGroupInvocation";
    case EbvSubGroupEqMask:       return "SubGroupEqMask";
    case EbvSubGroupGeMask:       return "SubGroupGeMask";
    case EbvSubGroupGtMask:       return "SubGroupGtMask";
    case EbvSubGroupLeMask:       return "SubGroupLeMask";
    case EbvSubGroupLtMask:       return "SubGroupLtMask";
    case EbvSubgroupSize2:        return "SubgroupSize";
    case EbvSubgroupInvocation2:  return "SubgroupInvocationID";
    case EbvSubgroupEqMask2:      return "SubgroupEqMask";
    case EbvSubgroupGeMask2:      return "SubgroupGeMask";
    case EbvSubgroupGtMask2:      return "SubgroupGtMask";
    case EbvSubgroupLeMask2:      return "SubgroupLeMask";
    case EbvSubgroupLtMask2:      return "SubgroupLtMask";
    case EbvVertexId:             return "VertexId";
    case EbvInstanceId:           return "InstanceId";
    case EbvVertexIndex:          return "VertexIndex";
    case EbvInstanceIndex:        return "InstanceIndex";
    case EbvBaseVertex:           return "BaseVertex";
    case EbvBaseInstance:         return "BaseInstance";
    case EbvDrawId:               return "DrawId";
    case EbvPosition:             return "Position";
    case EbvPointSize:            return "PointSize";
    case EbvClipVertex:           return "ClipVertex";
    case EbvClipDistance:         return "ClipDistance";
    case EbvCullDistance:         return "CullDistance";
    case EbvNormal:               return "Normal";
    case EbvVertex:               return "Vertex";
    case EbvMultiTexCoord0:       return "MultiTexCoord0";
    case EbvMultiTexCoord1:       return "MultiTexCoord1";
    case EbvMultiTexCoord2:       return "MultiTexCoord2";
    case EbvMultiTexCoord3:       return "MultiTexCoord3";
    case EbvMultiTexCoord4:       return "MultiTexCoord4";
    case EbvMultiTexCoord5:       return "MultiTexCoord5";
    case EbvMultiTexCoord6:       return "MultiTexCoord6";
    case EbvMultiTexCoord7:       return "MultiTexCoord7";
    case EbvFrontColor:           return "FrontColor";
    case EbvBackColor:            return "BackColor";
    case EbvFrontSecondaryColor:  return "FrontSecondaryColor";
    case EbvBackSecondaryColor:   return "BackSecondaryColor";
    case EbvTexCoord:             return "TexCoord";
    case EbvFogFragCoord:         return "FogFragCoord";
    case EbvInvocationId:         return "InvocationID";
    case EbvPrimitiveId:          return "PrimitiveID";
    case EbvLayer:                return "Layer";
    case EbvViewportIndex:        return "ViewportIndex";
    case EbvPatchVertices:        return "PatchVertices";
    case EbvTessLevelOuter:       return "TessLevelOuter";
    case EbvTessLevelInner:       return "TessLevelInner";
    case EbvBoundingBox:          return "BoundingBox";
    case EbvTessCoord:            return "TessCoord";
    case EbvColor:                return "Color";
    case EbvSecondaryColor:       return "SecondaryColor";
    case EbvFace:                 return "Face";
    case EbvFragCoord:            return "FragCoord";
    case EbvPointCoord:           return "PointCoord";
    case EbvFragColor:            return "FragColor";
    case EbvFragData:             return "FragData";
    case EbvFragDepth:            return "FragDepth";
    case EbvFragStencilRef:       return "FragStencilRef";
    case EbvSampleId:             return "SampleId";
    case EbvSamplePosition:       return "SamplePosition";
    case EbvSampleMask:           return "SampleMaskIn";
    case EbvHelperInvocation:     return "HelperInvocation";

    case EbvBaryCoordNoPersp:           return "BaryCoordNoPersp";
    case EbvBaryCoordNoPerspCentroid:   return "BaryCoordNoPerspCentroid";
    case EbvBaryCoordNoPerspSample:     return "BaryCoordNoPerspSample";
    case EbvBaryCoordSmooth:            return "BaryCoordSmooth";
    case EbvBaryCoordSmoothCentroid:    return "BaryCoordSmoothCentroid";
    case EbvBaryCoordSmoothSample:      return "BaryCoordSmoothSample";
    case EbvBaryCoordPullModel:         return "BaryCoordPullModel";

    case EbvViewIndex:                  return "ViewIndex";
    case EbvDeviceIndex:                return "DeviceIndex";

    case EbvFragSizeEXT:                return "FragSizeEXT";
    case EbvFragInvocationCountEXT:     return "FragInvocationCountEXT";

    case EbvSecondaryFragDataEXT:       return "SecondaryFragDataEXT";
    case EbvSecondaryFragColorEXT:      return "SecondaryFragColorEXT";

    case EbvViewportMaskNV:             return "ViewportMaskNV";
    case EbvSecondaryPositionNV:        return "SecondaryPositionNV";
    case EbvSecondaryViewportMaskNV:    return "SecondaryViewportMaskNV";
    case EbvPositionPerViewNV:          return "PositionPerViewNV";
    case EbvViewportMaskPerViewNV:      return "ViewportMaskPerViewNV";
    case EbvFragFullyCoveredNV:         return "FragFullyCoveredNV";
    case EbvFragmentSizeNV:             return "FragmentSizeNV";
    case EbvInvocationsPerPixelNV:      return "InvocationsPerPixelNV";
    case EbvLaunchId:                   return "LaunchIdNV";
    case EbvLaunchSize:                 return "LaunchSizeNV";
    case EbvInstanceCustomIndex:        return "InstanceCustomIndexNV";
    case EbvGeometryIndex:              return "GeometryIndexEXT";
    case EbvWorldRayOrigin:             return "WorldRayOriginNV";
    case EbvWorldRayDirection:          return "WorldRayDirectionNV";
    case EbvObjectRayOrigin:            return "ObjectRayOriginNV";
    case EbvObjectRayDirection:         return "ObjectRayDirectionNV";
    case EbvRayTmin:                    return "ObjectRayTminNV";
    case EbvRayTmax:                    return "ObjectRayTmaxNV";
    case EbvHitKind:                    return "HitKindNV";
    case EbvIncomingRayFlags:           return "IncomingRayFlagsNV";
    case EbvObjectToWorld:              return "ObjectToWorldNV";
    case EbvWorldToObject:              return "WorldToObjectNV";
    case EbvCurrentRayTimeNV:           return "CurrentRayTimeNV";
    case EbvClusterIDNV:                return "ClusterIDNV";

    case EbvBaryCoordEXT:
    case EbvBaryCoordNV:                return "BaryCoordKHR";
    case EbvBaryCoordNoPerspEXT:
    case EbvBaryCoordNoPerspNV:         return "BaryCoordNoPerspKHR";

    case EbvTaskCountNV:                return "TaskCountNV";
    case EbvPrimitiveCountNV:           return "PrimitiveCountNV";
    case EbvPrimitiveIndicesNV:         return "PrimitiveIndicesNV";
    case EbvClipDistancePerViewNV:      return "ClipDistancePerViewNV";
    case EbvCullDistancePerViewNV:      return "CullDistancePerViewNV";
    case EbvLayerPerViewNV:             return "LayerPerViewNV";
    case EbvMeshViewCountNV:            return "MeshViewCountNV";
    case EbvMeshViewIndicesNV:          return "MeshViewIndicesNV";
    // GL_EXT_mesh_shader
    case EbvPrimitivePointIndicesEXT:    return "PrimitivePointIndicesEXT";
    case EbvPrimitiveLineIndicesEXT:     return "PrimitiveLineIndicesEXT";
    case EbvPrimitiveTriangleIndicesEXT: return "PrimitiveTriangleIndicesEXT";
    case EbvCullPrimitiveEXT:            return "CullPrimitiveEXT";

    case EbvWarpsPerSM:                 return "WarpsPerSMNV";
    case EbvSMCount:                    return "SMCountNV";
    case EbvWarpID:                     return "WarpIDNV";
    case EbvSMID:                       return "SMIDNV";

    case EbvShadingRateKHR:             return "ShadingRateKHR";
    case EbvPrimitiveShadingRateKHR:    return "PrimitiveShadingRateKHR";

    case EbvHitKindFrontFacingMicroTriangleNV: return "HitKindFrontFacingMicroTriangleNV";
    case EbvHitKindBackFacingMicroTriangleNV:  return "HitKindBackFacingMicroTriangleNV";

    case EbvHitIsSphereNV:              return "HitIsSphereNV";
    case EbvHitIsLSSNV:                 return "HitIsLSSNV";
    case EbvHitSpherePositionNV:        return "HitSpherePositionNV";
    case EbvHitSphereRadiusNV:          return "HitSphereRadiusNV";
    case EbvHitLSSPositionsNV:          return "HitSpherePositionsNV";
    case EbvHitLSSRadiiNV:              return "HitLSSRadiiNV";

    default:                      return "unknown built-in variable";
    }
}